

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O3

void __thiscall
Js::JavascriptPromiseAllResolveElementFunction::JavascriptPromiseAllResolveElementFunction
          (JavascriptPromiseAllResolveElementFunction *this,DynamicType *type,
          FunctionInfo *functionInfo,uint32 index,JavascriptArray *values,
          JavascriptPromiseCapability *capabilities,
          JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper
          *remainingElementsWrapper)

{
  RuntimeFunction::RuntimeFunction(&this->super_RuntimeFunction,type,functionInfo);
  (this->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.
  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_0152e3d8;
  Memory::Recycler::WBSetBit((char *)&this->capabilities);
  (this->capabilities).ptr = capabilities;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->capabilities);
  this->index = index;
  Memory::Recycler::WBSetBit((char *)&this->remainingElementsWrapper);
  (this->remainingElementsWrapper).ptr = remainingElementsWrapper;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->remainingElementsWrapper);
  Memory::Recycler::WBSetBit((char *)&this->values);
  (this->values).ptr = values;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->values);
  this->alreadyCalled = false;
  return;
}

Assistant:

JavascriptPromiseAllResolveElementFunction::JavascriptPromiseAllResolveElementFunction(DynamicType* type, FunctionInfo* functionInfo, uint32 index, JavascriptArray* values, JavascriptPromiseCapability* capabilities, JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper* remainingElementsWrapper)
        : RuntimeFunction(type, functionInfo), index(index), values(values), capabilities(capabilities), remainingElementsWrapper(remainingElementsWrapper), alreadyCalled(false)
    { }